

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_7>>
::Visit<google::protobuf::DescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__7>>
           *this,Descriptor *descriptor,DescriptorProto *proto)

{
  EnumDescriptor *pEVar1;
  OneofDescriptor *pOVar2;
  FieldDescriptor *pFVar3;
  Descriptor *pDVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *proto_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_02;
  long lVar6;
  int index;
  long lVar7;
  
  if ((descriptor->merged_features_->field_0)._impl_.enforce_naming_style_ == 1) {
    DescriptorBuilder::
    ValidateNamingStyle<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
              (*(DescriptorBuilder **)this,descriptor,proto);
  }
  if (0 < descriptor->enum_type_count_) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pEVar1 = descriptor->enum_types_;
      proto_00 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                           (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                            (int)lVar7);
      Visit<google::protobuf::EnumDescriptorProto_const>
                (this,(EnumDescriptor *)(&pEVar1->super_SymbolBase + lVar6),proto_00);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x58;
    } while (lVar7 < descriptor->enum_type_count_);
  }
  if (0 < descriptor->oneof_decl_count_) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pOVar2 = descriptor->oneof_decls_;
      proto_01 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                           (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                            (int)lVar7);
      if (*(int *)(*(long *)((long)&pOVar2->merged_features_ + lVar6) + 0x48) == 1) {
        DescriptorBuilder::
        ValidateNamingStyle<google::protobuf::OneofDescriptor,google::protobuf::OneofDescriptorProto>
                  (*(DescriptorBuilder **)this,
                   (OneofDescriptor *)(&pOVar2->super_SymbolBase + lVar6),proto_01);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x38;
    } while (lVar7 < descriptor->oneof_decl_count_);
  }
  if (0 < descriptor->field_count_) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pFVar3 = descriptor->fields_;
      pVVar5 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(proto->field_0)._impl_.field_.super_RepeatedPtrFieldBase,(int)lVar7);
      if (*(int *)(*(long *)((long)&pFVar3->merged_features_ + lVar6) + 0x48) == 1) {
        DescriptorBuilder::
        ValidateNamingStyle<google::protobuf::FieldDescriptor,google::protobuf::FieldDescriptorProto>
                  (*(DescriptorBuilder **)this,
                   (FieldDescriptor *)(&pFVar3->super_SymbolBase + lVar6),pVVar5);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x58;
    } while (lVar7 < descriptor->field_count_);
  }
  if (0 < descriptor->nested_type_count_) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pDVar4 = descriptor->nested_types_;
      proto_02 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                            (int)lVar7);
      Visit<google::protobuf::DescriptorProto_const>
                (this,(Descriptor *)(&pDVar4->super_SymbolBase + lVar6),proto_02);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0xa0;
    } while (lVar7 < descriptor->nested_type_count_);
  }
  if (0 < descriptor->extension_count_) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pFVar3 = descriptor->extensions_;
      pVVar5 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,(int)lVar7)
      ;
      if (*(int *)(*(long *)((long)&pFVar3->merged_features_ + lVar6) + 0x48) == 1) {
        DescriptorBuilder::
        ValidateNamingStyle<google::protobuf::FieldDescriptor,google::protobuf::FieldDescriptorProto>
                  (*(DescriptorBuilder **)this,
                   (FieldDescriptor *)(&pFVar3->super_SymbolBase + lVar6),pVVar5);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x58;
    } while (lVar7 < descriptor->extension_count_);
  }
  if (0 < descriptor->extension_range_count_) {
    index = 0;
    do {
      RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,index);
      index = index + 1;
    } while (index < descriptor->extension_range_count_);
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }